

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConsoleTable.cpp
# Opt level: O1

void __thiscall ConsoleTable::updateHeader(ConsoleTable *this,uint header,string *text)

{
  pointer pbVar1;
  out_of_range *this_00;
  
  pbVar1 = (this->headers).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)header <=
      (ulong)((long)(this->headers).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5)) {
    std::__cxx11::string::_M_assign((string *)(pbVar1 + header));
    return;
  }
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  std::out_of_range::out_of_range(this_00,"Header index out of range.");
  __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

void ConsoleTable::updateHeader(unsigned int header, std::string text) {
    if (header > headers.size())
        throw std::out_of_range{"Header index out of range."};

    headers[header] = text;
}